

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O3

void __thiscall HACD::HACD::CreateGraph(HACD *this)

{
  _Rb_tree_header *p_Var1;
  Graph *this_00;
  long lVar2;
  Vec3<long> *pVVar3;
  ulong uVar4;
  ulong uVar5;
  Vec3<double> *pVVar6;
  undefined1 auVar7 [32];
  int i;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  pointer psVar16;
  undefined1 auVar17 [32];
  undefined1 auVar19 [16];
  uint uVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  vertexToTriangles;
  unsigned_long_long tr2 [3];
  unsigned_long_long tr1 [3];
  char msg [1024];
  double local_508;
  _Rb_tree_node_base *local_500;
  undefined1 local_4e8 [16];
  pointer local_4d8;
  ulong local_4d0;
  long local_4c8;
  ulong local_4c0;
  HACD *local_4b8;
  long local_4b0;
  _Rb_tree_node_base *local_4a8;
  _Base_ptr *local_4a0;
  pointer local_498;
  double local_490;
  double local_488;
  double local_480;
  long local_478;
  long lStack_470;
  long lStack_468;
  undefined8 uStack_460;
  long local_458 [4];
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  local_438 [43];
  undefined1 auVar18 [32];
  
  local_4e8 = (undefined1  [16])0x0;
  local_4d8 = (pointer)0x0;
  std::
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ::resize((vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
            *)local_4e8,this->m_nPoints);
  if (this->m_nTriangles != 0) {
    lVar12 = 0;
    psVar16 = (pointer)0x0;
    do {
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar16;
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_insert_unique<long>
                ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                  *)(local_4e8._0_8_ + *(long *)((long)this->m_triangles->m_data + lVar12) * 0x30),
                 (long *)local_438);
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar16;
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_insert_unique<long>
                ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                  *)(local_4e8._0_8_ +
                    *(long *)((long)this->m_triangles->m_data + lVar12 + 8) * 0x30),
                 (long *)local_438);
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar16;
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_insert_unique<long>
                ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                  *)(local_4e8._0_8_ +
                    *(long *)((long)this->m_triangles->m_data + lVar12 + 0x10) * 0x30),
                 (long *)local_438);
      psVar16 = (pointer)&(psVar16->_M_t)._M_impl.field_0x1;
      lVar12 = lVar12 + 0x18;
    } while (psVar16 < (undefined1 *)this->m_nTriangles);
  }
  this_00 = &this->m_graph;
  Graph::Clear(this_00);
  Graph::Allocate(this_00,this->m_nTriangles,this->m_nTriangles * 5);
  uVar14 = this->m_nPoints;
  if (uVar14 != 0) {
    uVar13 = 0;
    do {
      p_Var1 = &(((pointer)(local_4e8._0_8_ + uVar13 * 0x30))->_M_t)._M_impl.super__Rb_tree_header;
      p_Var10 = (p_Var1->_M_header)._M_left;
      if ((_Rb_tree_header *)p_Var10 != p_Var1) {
        do {
          lVar12 = *(long *)(p_Var10 + 1);
          pVVar3 = this->m_triangles;
          uVar14 = pVVar3[lVar12].m_data[1];
          uVar4 = pVVar3[lVar12].m_data[0];
          uVar5 = pVVar3[lVar12].m_data[2];
          local_458[0] = (uVar14 << 0x20) + uVar4;
          if (uVar14 < uVar4) {
            local_458[0] = (uVar4 << 0x20) + uVar14;
          }
          local_458[1] = (uVar5 << 0x20) + uVar14;
          if (uVar5 < uVar14) {
            local_458[1] = (uVar14 << 0x20) + uVar5;
          }
          local_458[2] = (uVar4 << 0x20) + uVar5;
          if (uVar4 < uVar5) {
            local_458[2] = (uVar5 << 0x20) + uVar4;
          }
          for (p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
              (_Rb_tree_header *)p_Var8 != p_Var1;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            lVar15 = *(long *)(p_Var8 + 1);
            pVVar3 = this->m_triangles;
            uVar14 = pVVar3[lVar15].m_data[1];
            uVar4 = pVVar3[lVar15].m_data[0];
            uVar5 = pVVar3[lVar15].m_data[2];
            local_478 = (uVar14 << 0x20) + uVar4;
            if (uVar14 < uVar4) {
              local_478 = (uVar4 << 0x20) + uVar14;
            }
            lStack_470 = (uVar5 << 0x20) + uVar14;
            if (uVar5 < uVar14) {
              lStack_470 = (uVar14 << 0x20) + uVar5;
            }
            lStack_468 = (uVar4 << 0x20) + uVar5;
            if (uVar4 < uVar5) {
              lStack_468 = (uVar5 << 0x20) + uVar4;
            }
            lVar9 = 0;
            uVar20 = 0;
            auVar17._8_8_ = lStack_470;
            auVar17._0_8_ = local_478;
            auVar17._16_8_ = lStack_468;
            auVar17._24_8_ = uStack_460;
            auVar17 = vmovdqu64_avx512vl(auVar17);
            auVar18._0_24_ = auVar17._0_24_;
            auVar18._24_8_ = 0;
            do {
              lVar2 = local_458[lVar9];
              auVar7._8_8_ = lVar2;
              auVar7._0_8_ = lVar2;
              auVar7._16_8_ = lVar2;
              auVar7._24_8_ = lVar2;
              uVar14 = vpcmpeqq_avx512vl(auVar18,auVar7);
              lVar9 = lVar9 + 1;
              auVar19 = vpmovm2d_avx512vl(uVar14 & 0xf);
              auVar19 = vpsubd_avx(ZEXT416(uVar20),auVar19);
              auVar19 = vpblendd_avx2(auVar19,(undefined1  [16])0x0,8);
              auVar19 = vphaddd_avx(auVar19,auVar19);
              auVar19 = vphaddd_avx(auVar19,auVar19);
              uVar20 = auVar19._0_4_;
            } while (lVar9 != 3);
            if (uVar20 == 1) {
              Graph::AddEdge(this_00,lVar12,lVar15);
            }
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != p_Var1);
        uVar14 = this->m_nPoints;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar14);
  }
  if (0.0 <= this->m_ccConnectDist) {
    Graph::ExtractCCs(this_00);
    if (this->m_callBack != (CallBackFunction)0x0) {
      sprintf((char *)local_438,"nCC %lu\n",(this->m_graph).m_nCCs);
      (*this->m_callBack)((char *)local_438,0.0,0.0,(this->m_graph).m_nV);
    }
    uVar14 = (this->m_graph).m_nCCs;
    if (1 < uVar14) {
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ::resize(local_438,uVar14);
      if (this->m_nTriangles != 0) {
        lVar12 = 8;
        lVar15 = 0;
        uVar14 = 0;
        do {
          lVar9 = *(long *)((long)(((this->m_graph).m_vertices.
                                    super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_edges).m_data0 +
                           lVar12 + -0x10);
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)(local_438[0].
                         super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9),
                     (long *)((long)this->m_triangles->m_data + lVar15));
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)(local_438[0].
                         super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9),
                     (long *)((long)this->m_triangles->m_data + lVar15 + 8));
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)(local_438[0].
                         super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9),
                     (long *)((long)this->m_triangles->m_data + lVar15 + 0x10));
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + 0x18;
          lVar12 = lVar12 + 0x310;
        } while (uVar14 < this->m_nTriangles);
      }
      uVar14 = (this->m_graph).m_nCCs;
      if (uVar14 != 0) {
        local_4d0 = 0;
        local_4b8 = this;
        do {
          uVar13 = local_4d0 + 1;
          uVar4 = uVar13;
          if (uVar13 < uVar14) {
            local_4c8 = local_4d0 * 0x30;
            local_4d0 = uVar13;
            do {
              local_4a8 = (_Rb_tree_node_base *)
                          ((long)&((local_438[0].
                                    super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                  super__Rb_tree_header._M_header._M_color + local_4c8);
              local_500 = local_4a8->_M_left;
              if (local_500 != local_4a8) {
                local_4b0 = uVar13 * 0x30;
                local_4c0 = uVar13;
                do {
                  p_Var10 = (_Rb_tree_node_base *)
                            ((long)&((local_438[0].
                                      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                    super__Rb_tree_header._M_header._M_color + local_4b0);
                  p_Var8 = p_Var10->_M_left;
                  if (p_Var8 != p_Var10) {
                    pVVar6 = this->m_points;
                    lVar15 = -1;
                    lVar9 = -1;
                    lVar12 = *(long *)(local_500 + 1);
                    local_498 = (pointer)local_4e8._0_8_;
                    local_488 = pVVar6[lVar12].m_data[1];
                    local_480 = pVVar6[lVar12].m_data[0];
                    local_490 = pVVar6[lVar12].m_data[2];
                    local_4a0 = &(((pointer)(local_4e8._0_8_ + lVar12 * 0x30))->_M_t)._M_impl.
                                 super__Rb_tree_header._M_header._M_left;
                    local_508 = 1.79769313486232e+308;
                    do {
                      lVar12 = *(long *)(p_Var8 + 1);
                      dVar21 = local_488 - pVVar6[lVar12].m_data[1];
                      auVar19._8_8_ = 0;
                      auVar19._0_8_ = local_480 - pVVar6[lVar12].m_data[0];
                      auVar22._8_8_ = 0;
                      auVar22._0_8_ = dVar21 * dVar21;
                      auVar19 = vfmadd231sd_fma(auVar22,auVar19,auVar19);
                      auVar23._8_8_ = 0;
                      auVar23._0_8_ = local_490 - pVVar6[lVar12].m_data[2];
                      auVar19 = vfmadd231sd_fma(auVar19,auVar23,auVar23);
                      auVar19 = vsqrtsd_avx(auVar19,auVar19);
                      dVar21 = auVar19._0_8_;
                      if (dVar21 < local_508) {
                        p_Var1 = &local_498[lVar12]._M_t._M_impl.super__Rb_tree_header;
                        lVar15 = *(long *)(*local_4a0 + 1);
                        for (p_Var11 = (p_Var1->_M_header)._M_left;
                            (lVar9 = -1, local_508 = dVar21, (_Rb_tree_header *)p_Var11 != p_Var1 &&
                            (lVar9 = *(long *)(p_Var11 + 1), lVar9 == lVar15));
                            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
                        }
                      }
                      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
                      this = local_4b8;
                    } while (p_Var8 != p_Var10);
                    if (((local_508 <= local_4b8->m_ccConnectDist) && (-1 < lVar15)) && (-1 < lVar9)
                       ) {
                      Graph::AddEdge(this_00,lVar15,lVar9);
                    }
                  }
                  local_500 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_500);
                } while (local_500 != local_4a8);
                uVar14 = (this->m_graph).m_nCCs;
                uVar13 = local_4c0;
              }
              uVar13 = uVar13 + 1;
              uVar4 = local_4d0;
            } while (uVar13 < uVar14);
          }
          local_4d0 = uVar4;
        } while (local_4d0 < uVar14);
      }
      std::
      vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ::~vector(local_438);
    }
  }
  std::
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ::~vector((vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
             *)local_4e8);
  return;
}

Assistant:

void HACD::CreateGraph()
    {
		// vertex to triangle adjacency information
		std::vector< std::set<long> >  vertexToTriangles;		
		vertexToTriangles.resize(m_nPoints);
		for(size_t t = 0; t < m_nTriangles; ++t)
		{
			vertexToTriangles[m_triangles[t].X()].insert(static_cast<long>(t));
			vertexToTriangles[m_triangles[t].Y()].insert(static_cast<long>(t));
			vertexToTriangles[m_triangles[t].Z()].insert(static_cast<long>(t));
		}

		m_graph.Clear();
		m_graph.Allocate(m_nTriangles, 5 * m_nTriangles);
		unsigned long long tr1[3];
		unsigned long long tr2[3];
        long i1, j1, k1, i2, j2, k2;
        long t1, t2;
        for (size_t v = 0; v < m_nPoints; v++) 
		{
			std::set<long>::const_iterator it1(vertexToTriangles[v].begin()), itEnd(vertexToTriangles[v].end()); 
			for(; it1 != itEnd; ++it1)
			{
                t1 = *it1;
                i1 = m_triangles[t1].X();
                j1 = m_triangles[t1].Y();
                k1 = m_triangles[t1].Z();
				tr1[0] = GetEdgeIndex(i1, j1);
				tr1[1] = GetEdgeIndex(j1, k1);
				tr1[2] = GetEdgeIndex(k1, i1);
				std::set<long>::const_iterator it2(it1);
				for(++it2; it2 != itEnd; ++it2)
				{
                    t2 = *it2;
                    i2 = m_triangles[t2].X();
                    j2 = m_triangles[t2].Y();
                    k2 = m_triangles[t2].Z();
					tr2[0] = GetEdgeIndex(i2, j2);
					tr2[1] = GetEdgeIndex(j2, k2);
					tr2[2] = GetEdgeIndex(k2, i2);
					int shared = 0;
					for(int i = 0; i < 3; ++i)
					{
						for(int j = 0; j < 3; ++j)
						{
							if (tr1[i] == tr2[j])	
							{
								shared++;
							}
						}
					}
					if (shared == 1) // two triangles are connected if they share exactly one edge
					{
						m_graph.AddEdge(t1, t2);
					}
				}
			}
        }
        if (m_ccConnectDist >= 0.0)
        {
            m_graph.ExtractCCs();
            if (m_callBack)
            {
                char msg[1024];
                sprintf(msg, "nCC " SIZET_FMT "\n", m_graph.m_nCCs);
                (*m_callBack)(msg, 0.0, 0.0,  m_graph.GetNVertices());
                
            }
            
            if (m_graph.m_nCCs > 1) 
            {
                std::vector< std::set<long> > cc2V;
                cc2V.resize(m_graph.m_nCCs);
                long cc;
                for(size_t t = 0; t < m_nTriangles; ++t)
                {
                    cc = m_graph.m_vertices[t].m_cc;
                    cc2V[cc].insert(m_triangles[t].X());
                    cc2V[cc].insert(m_triangles[t].Y());
                    cc2V[cc].insert(m_triangles[t].Z());
                }
                
                for(size_t cc1 = 0; cc1 < m_graph.m_nCCs; ++cc1)
                {
                    for(size_t cc2 = cc1+1; cc2 < m_graph.m_nCCs; ++cc2)
                    {
                        std::set<long>::const_iterator itV1(cc2V[cc1].begin()), itVEnd1(cc2V[cc1].end()); 
                        for(; itV1 != itVEnd1; ++itV1)
                        {
							double distC1C2 = std::numeric_limits<double>::max();
                            double dist;
                            t1 = -1;
                            t2 = -1;
                            std::set<long>::const_iterator itV2(cc2V[cc2].begin()), itVEnd2(cc2V[cc2].end()); 
                            for(; itV2 != itVEnd2; ++itV2)
                            {
                                dist = (m_points[*itV1] - m_points[*itV2]).GetNorm();
                                if (dist < distC1C2)
                                {
                                    distC1C2 = dist;
                                    t1 = *vertexToTriangles[*itV1].begin();
                                    
									std::set<long>::const_iterator it2(vertexToTriangles[*itV2].begin()), 
																   it2End(vertexToTriangles[*itV2].end()); 
									t2 = -1;
									for(; it2 != it2End; ++it2)
									{
										if (*it2 != t1)
										{
											t2 = *it2;
											break;
										}
									}
                                }
                            }
                            if (distC1C2 <= m_ccConnectDist && t1 >= 0 && t2 >= 0)
                            {
                                m_graph.AddEdge(t1, t2);                    
                            }
                        }
                    }
                }
            }
        }
    }